

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O0

void __thiscall
QSortFilterProxyModelPrivate::_q_sourceColumnsInserted
          (QSortFilterProxyModelPrivate *this,QModelIndex *source_parent,int start,int end)

{
  long lVar1;
  bool bVar2;
  parameter_type pVar3;
  int iVar4;
  QSortFilterProxyModel *pQVar5;
  arrow_operator_result ppQVar6;
  int in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  QSortFilterProxyModelPrivate *in_RDI;
  long in_FS_OFFSET;
  QSortFilterProxyModel *q;
  Direction in_stack_0000009c;
  int in_stack_000000a0;
  int in_stack_000000a4;
  QModelIndex *in_stack_000000a8;
  QSortFilterProxyModelPrivate *in_stack_000000b0;
  QSortFilterProxyModelPrivate *this_00;
  undefined1 local_38 [24];
  undefined1 local_20 [8];
  QSortFilterProxyModelPrivate *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar5 = q_func(in_RDI);
  source_items_inserted
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,in_stack_000000a0,
             in_stack_0000009c);
  bVar2 = QModelIndex::isValid((QModelIndex *)in_RDI);
  if (!bVar2) {
    if (in_RDI->source_sort_column == -1) {
      bVar2 = update_source_sort_column(this_00);
      if ((bVar2) &&
         (pVar3 = ::QObjectCompatProperty::operator_cast_to_bool
                            ((QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_dynamic_sortfilter_offset,_&QSortFilterProxyModelPrivate::setDynamicSortFilterForwarder,_nullptr,_nullptr>
                              *)0x874f7d), pVar3)) {
        sort(in_stack_ffffffffffffffe8);
      }
    }
    else {
      if (in_EDX <= in_RDI->source_sort_column) {
        in_RDI->source_sort_column = (in_ECX - in_EDX) + 1 + in_RDI->source_sort_column;
      }
      ppQVar6 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                ::operator->((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                              *)in_RDI);
      (*((*ppQVar6)->super_QObject)._vptr_QObject[0xc])
                (local_38,*ppQVar6,0,(ulong)(uint)in_RDI->source_sort_column,in_RSI);
      (*(pQVar5->super_QAbstractProxyModel).super_QAbstractItemModel.super_QObject._vptr_QObject
        [0x33])(local_20,pQVar5,local_38);
      iVar4 = QModelIndex::column((QModelIndex *)local_20);
      in_RDI->proxy_sort_column = iVar4;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSortFilterProxyModelPrivate::_q_sourceColumnsInserted(
    const QModelIndex &source_parent, int start, int end)
{
    Q_Q(const QSortFilterProxyModel);
    source_items_inserted(source_parent, start, end, Direction::Columns);

    if (source_parent.isValid())
        return; //we sort according to the root column only
    if (source_sort_column == -1) {
        //we update the source_sort_column depending on the proxy_sort_column
        if (update_source_sort_column() && dynamic_sortfilter)
            sort();
    } else {
        if (start <= source_sort_column)
            source_sort_column += end - start + 1;

        proxy_sort_column = q->mapFromSource(model->index(0,source_sort_column, source_parent)).column();
    }
}